

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O3

CURLcode Curl_sasl_parse_url_auth_option(SASL *sasl,char *value,size_t len)

{
  int iVar1;
  uint uVar2;
  size_t in_RAX;
  CURLcode CVar3;
  size_t mechlen;
  size_t local_28;
  
  CVar3 = CURLE_URL_MALFORMAT;
  if (len != 0) {
    if (sasl->resetprefs == true) {
      sasl->resetprefs = false;
      sasl->prefmech = 0;
    }
    local_28 = in_RAX;
    iVar1 = strncmp(value,"*",len);
    if (iVar1 == 0) {
      sasl->prefmech = 0xffffffdf;
    }
    else {
      uVar2 = Curl_sasl_decode_mech(value,len,&local_28);
      if (uVar2 == 0) {
        return CURLE_URL_MALFORMAT;
      }
      if (local_28 != len) {
        return CURLE_URL_MALFORMAT;
      }
      sasl->prefmech = sasl->prefmech | uVar2;
    }
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

CURLcode Curl_sasl_parse_url_auth_option(struct SASL *sasl,
                                         const char *value, size_t len)
{
  CURLcode result = CURLE_OK;
  size_t mechlen;

  if(!len)
    return CURLE_URL_MALFORMAT;

  if(sasl->resetprefs) {
    sasl->resetprefs = FALSE;
    sasl->prefmech = SASL_AUTH_NONE;
  }

  if(!strncmp(value, "*", len))
    sasl->prefmech = SASL_AUTH_DEFAULT;
  else {
    unsigned int mechbit = Curl_sasl_decode_mech(value, len, &mechlen);
    if(mechbit && mechlen == len)
      sasl->prefmech |= mechbit;
    else
      result = CURLE_URL_MALFORMAT;
  }

  return result;
}